

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O3

quaternion * quaternion_inverse(quaternion *self)

{
  float fVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  undefined1 auVar5 [16];
  anon_union_16_3_07544b10_for_quaternion_0 aVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  fVar9 = (self->field_0).q[0];
  uVar2 = *(ulong *)((long)&self->field_0 + 4);
  uVar4 = *(ulong *)&self->field_0;
  fVar7 = (float)(uVar2 >> 0x20);
  fVar1 = (self->field_0).q[3];
  fVar8 = fVar1 * fVar1 + fVar7 * fVar7 + fVar9 * fVar9 + (float)uVar2 * (float)uVar2;
  if (1e-05 <= fVar8) {
    (self->field_0).q[0] = -fVar9;
    *(ulong *)((long)&self->field_0 + 4) = uVar2 ^ 0x8000000080000000;
    fVar10 = fVar8 + -1.0;
    fVar9 = -fVar10;
    if (-fVar10 <= fVar10) {
      fVar9 = fVar10;
    }
    if (1e-05 <= fVar9) {
      auVar5._0_8_ = uVar4 ^ 0x8000000080000000;
      auVar5._8_4_ = -fVar7;
      auVar5._12_4_ = fVar1;
      auVar3._4_4_ = fVar8;
      auVar3._0_4_ = fVar8;
      auVar3._8_4_ = fVar8;
      auVar3._12_4_ = fVar8;
      aVar6 = (anon_union_16_3_07544b10_for_quaternion_0)divps(auVar5,auVar3);
      self->field_0 = aVar6;
    }
  }
  return self;
}

Assistant:

HYPAPI struct quaternion *quaternion_inverse(struct quaternion *self)
{
	HYP_FLOAT norm;

	norm = quaternion_norm(self);

	if (scalar_equalsf(norm, 0.0f)) {
		/* avoid divide by zero */
		return self;
	}

	quaternion_conjugate(self);

	if (scalar_equalsf(norm, 1.0f)) {
		/* we're done */
		return self;
	}

	self->x /= norm;
	self->y /= norm;
	self->z /= norm;
	self->w /= norm;

	return self;
}